

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O0

int __thiscall sf::priv::JoystickImpl::open(JoystickImpl *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  char *__file_00;
  ostream *poVar6;
  int *piVar7;
  void *this_00;
  uint index;
  JoystickState local_dc;
  locale local_98 [8];
  string local_90;
  String local_70;
  undefined1 local_40 [8];
  string devnode;
  uint index_local;
  JoystickImpl *this_local;
  
  devnode.field_2._12_4_ = SUB84(__file,0);
  pvVar5 = (reference)((ulong)__file & 0xffffffff);
  pvVar4 = (reference)
           std::
           vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
           ::size((vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
                   *)(anonymous_namespace)::joystickList);
  if (pvVar5 < pvVar4) {
    pvVar5 = std::
             vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
             ::operator[]((vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
                           *)(anonymous_namespace)::joystickList,(ulong)(uint)devnode.field_2._12_4_
                         );
    if ((pvVar5->plugged & 1U) != 0) {
      pvVar5 = std::
               vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
               ::operator[]((vector<(anonymous_namespace)::JoystickRecord,_std::allocator<(anonymous_namespace)::JoystickRecord>_>
                             *)(anonymous_namespace)::joystickList,
                            (ulong)(uint)devnode.field_2._12_4_);
      std::__cxx11::string::string((string *)local_40,(string *)pvVar5);
      __file_00 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_40);
      iVar2 = ::open(__file_00,0x800);
      this->m_file = iVar2;
      if (this->m_file < 0) {
        poVar6 = err();
        poVar6 = std::operator<<(poVar6,"Failed to open joystick ");
        poVar6 = std::operator<<(poVar6,(string *)local_40);
        poVar6 = std::operator<<(poVar6,": ");
        piVar7 = __errno_location();
        this_00 = (void *)std::ostream::operator<<(poVar6,*piVar7);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        bVar1 = false;
      }
      else {
        ioctl(this->m_file,0x80406a32,this->m_mapping);
        (anonymous_namespace)::getJoystickName_abi_cxx11_
                  (&local_90,(_anonymous_namespace_ *)(ulong)(uint)devnode.field_2._12_4_,index);
        std::locale::locale(local_98);
        String::String(&local_70,&local_90,local_98);
        String::operator=(&(this->m_identification).name,&local_70);
        String::~String(&local_70);
        std::locale::~locale(local_98);
        std::__cxx11::string::~string((string *)&local_90);
        if ((anonymous_namespace)::udevContext != 0) {
          uVar3 = anon_unknown.dwarf_96114::getJoystickVendorId(devnode.field_2._12_4_);
          (this->m_identification).vendorId = uVar3;
          uVar3 = anon_unknown.dwarf_96114::getJoystickProductId(devnode.field_2._12_4_);
          (this->m_identification).productId = uVar3;
        }
        JoystickState::JoystickState(&local_dc);
        memcpy(&this->m_state,&local_dc,0x44);
        this_local._7_1_ = 1;
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)local_40);
      pvVar5 = (reference)0x0;
      if (bVar1) goto LAB_00149bbd;
    }
    this_local._7_1_ = 0;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00149bbd:
  return (uint)CONCAT71((int7)((ulong)pvVar5 >> 8),this_local._7_1_) & 0xffffff01;
}

Assistant:

bool JoystickImpl::open(unsigned int index)
{
    if (index >= joystickList.size())
        return false;

    if (joystickList[index].plugged)
    {
        std::string devnode = joystickList[index].deviceNode;

        // Open the joystick's file descriptor (read-only and non-blocking)
        m_file = ::open(devnode.c_str(), O_RDONLY | O_NONBLOCK);
        if (m_file >= 0)
        {
            // Retrieve the axes mapping
            ioctl(m_file, JSIOCGAXMAP, m_mapping);

            // Get info
            m_identification.name = getJoystickName(index);

            if (udevContext)
            {
                m_identification.vendorId  = getJoystickVendorId(index);
                m_identification.productId = getJoystickProductId(index);
            }

            // Reset the joystick state
            m_state = JoystickState();

            return true;
        }
        else
        {
            err() << "Failed to open joystick " << devnode << ": " << errno << std::endl;
        }
    }

    return false;
}